

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context,char *code)

{
  bool bVar1;
  ContextType CVar2;
  GLSLVersion version;
  mapped_type *pmVar3;
  key_type kStack_98;
  allocator<char> local_71;
  string local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializationMap;
  
  CVar2.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 8) + 0x10))();
  version = glu::getContextTypeGLSLVersion(CVar2);
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &specializationMap._M_t._M_impl.super__Rb_tree_header._M_header;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"GLSL_VERSION_DECL",(allocator<char> *)&local_70);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&specializationMap,&kStack_98);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&kStack_98);
  CVar2.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 8) + 0x10))();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"GEOMETRY_SHADER_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"GEOMETRY_POINT_SIZE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"GPU_SHADER5_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"TESSELLATION_SHADER_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"TESSELLATION_POINT_SIZE_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"PRIMITIVE_BOUNDING_BOX_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"PRIM_GL_BOUNDING_BOX",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"GEOMETRY_SHADER_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"GEOMETRY_POINT_SIZE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"GPU_SHADER5_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"TESSELLATION_SHADER_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"TESSELLATION_POINT_SIZE_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"PRIMITIVE_BOUNDING_BOX_REQUIRE",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_98,"PRIM_GL_BOUNDING_BOX",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&specializationMap,&kStack_98);
    std::__cxx11::string::assign((char *)pmVar3);
  }
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)context,&local_71);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&kStack_98,&local_70);
  tcu::StringTemplate::specialize
            (__return_storage_ptr__,(StringTemplate *)&kStack_98,&specializationMap);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&specializationMap._M_t);
  return __return_storage_ptr__;
}

Assistant:

static std::string specializeShader(Context& context, const char* code)
{
	const glu::GLSLVersion				glslVersion			= glu::getContextTypeGLSLVersion(context.getRenderContext().getType());
	std::map<std::string, std::string>	specializationMap;

	specializationMap["GLSL_VERSION_DECL"] = glu::getGLSLVersionDeclaration(glslVersion);

	if (glu::contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		specializationMap["GPU_SHADER5_REQUIRE"] = "";
	else
		specializationMap["GPU_SHADER5_REQUIRE"] = "#extension GL_EXT_gpu_shader5 : require";

	return tcu::StringTemplate(code).specialize(specializationMap);
}